

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

bool __thiscall
cmForEachCommand::HandleInMode
          (cmForEachCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmForEachFunctionBlocker *this_00;
  pointer pcVar3;
  const_reference pvVar4;
  ulong uVar5;
  size_type sVar6;
  char *__s;
  ostream *poVar7;
  string local_208;
  undefined1 local_1e8 [8];
  ostringstream e;
  allocator<char> local_69;
  string local_68;
  char *local_48;
  char *value;
  int local_38;
  uint i;
  Doing doing;
  unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_> local_28;
  unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_> f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmForEachCommand *this_local;
  
  f._M_t.
  super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
  .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>,_true,_true>
        )(__uniq_ptr_data<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>,_true,_true>
          )args;
  this_00 = (cmForEachFunctionBlocker *)operator_new(0x90);
  cmForEachFunctionBlocker::cmForEachFunctionBlocker(this_00,(this->super_cmCommand).Makefile);
  std::unique_ptr<cmForEachFunctionBlocker,std::default_delete<cmForEachFunctionBlocker>>::
  unique_ptr<std::default_delete<cmForEachFunctionBlocker>,void>
            ((unique_ptr<cmForEachFunctionBlocker,std::default_delete<cmForEachFunctionBlocker>> *)
             &local_28,this_00);
  pcVar3 = std::unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
           ::operator->(&local_28);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)f._M_t.
                           super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
                           .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>._M_head_impl,0)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pcVar3->Args,pvVar4);
  local_38 = 0;
  value._4_4_ = 2;
  do {
    uVar5 = (ulong)value._4_4_;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)f._M_t.
                      super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
                      .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>._M_head_impl);
    if (sVar6 <= uVar5) {
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar3 = std::
               unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
               ::release(&local_28);
      cmMakefile::AddFunctionBlocker(pcVar1,&pcVar3->super_cmFunctionBlocker);
LAB_003fd8e6:
      std::unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>::
      ~unique_ptr(&local_28);
      return true;
    }
    if (local_38 == 2) {
      pcVar3 = std::
               unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
               ::operator->(&local_28);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)f._M_t.
                               super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
                               .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>.
                               _M_head_impl,(ulong)value._4_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pcVar3->Args,pvVar4);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)f._M_t.
                               super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
                               .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>.
                               _M_head_impl,(ulong)value._4_4_);
      bVar2 = std::operator==(pvVar4,"LISTS");
      if (bVar2) {
        local_38 = 1;
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)f._M_t.
                                 super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
                                 .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>.
                                 _M_head_impl,(ulong)value._4_4_);
        bVar2 = std::operator==(pvVar4,"ITEMS");
        if (bVar2) {
          local_38 = 2;
        }
        else {
          if (local_38 != 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
            poVar7 = std::operator<<((ostream *)local_1e8,"Unknown argument:\n");
            poVar7 = std::operator<<(poVar7,"  ");
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)f._M_t.
                                     super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
                                     .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>.
                                     _M_head_impl,(ulong)value._4_4_);
            poVar7 = std::operator<<(poVar7,(string *)pvVar4);
            std::operator<<(poVar7,"\n");
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_208);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
            goto LAB_003fd8e6;
          }
          pcVar1 = (this->super_cmCommand).Makefile;
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)f._M_t.
                                   super___uniq_ptr_impl<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmForEachFunctionBlocker_*,_std::default_delete<cmForEachFunctionBlocker>_>
                                   .super__Head_base<0UL,_cmForEachFunctionBlocker_*,_false>.
                                   _M_head_impl,(ulong)value._4_4_);
          __s = cmMakefile::GetDefinition(pcVar1,pvVar4);
          local_48 = __s;
          if ((__s != (char *)0x0) && (*__s != '\0')) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
            pcVar3 = std::
                     unique_ptr<cmForEachFunctionBlocker,_std::default_delete<cmForEachFunctionBlocker>_>
                     ::operator->(&local_28);
            cmSystemTools::ExpandListArgument(&local_68,&pcVar3->Args,true);
            std::__cxx11::string::~string((string *)&local_68);
            std::allocator<char>::~allocator(&local_69);
          }
        }
      }
    }
    value._4_4_ = value._4_4_ + 1;
  } while( true );
}

Assistant:

bool cmForEachCommand::HandleInMode(std::vector<std::string> const& args)
{
  std::unique_ptr<cmForEachFunctionBlocker> f(
    new cmForEachFunctionBlocker(this->Makefile));
  f->Args.push_back(args[0]);

  enum Doing
  {
    DoingNone,
    DoingLists,
    DoingItems
  };
  Doing doing = DoingNone;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (doing == DoingItems) {
      f->Args.push_back(args[i]);
    } else if (args[i] == "LISTS") {
      doing = DoingLists;
    } else if (args[i] == "ITEMS") {
      doing = DoingItems;
    } else if (doing == DoingLists) {
      const char* value = this->Makefile->GetDefinition(args[i]);
      if (value && *value) {
        cmSystemTools::ExpandListArgument(value, f->Args, true);
      }
    } else {
      std::ostringstream e;
      e << "Unknown argument:\n"
        << "  " << args[i] << "\n";
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return true;
    }
  }

  this->Makefile->AddFunctionBlocker(f.release()); // TODO: pass unique_ptr

  return true;
}